

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O2

bool __thiscall BamTools::BamAlignment::BuildCharData(BamAlignment *this)

{
  string *psVar1;
  uint32_t uVar2;
  pointer pCVar3;
  pointer pcVar4;
  bool bVar5;
  uint uVar6;
  char cVar7;
  pointer pCVar8;
  uint uVar9;
  size_t i;
  ulong uVar10;
  allocator local_91;
  string *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  uint32_t local_7c;
  ulong local_78;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->SupportData).HasCoreOnly == true) {
    local_7c = (this->SupportData).BlockLength;
    uVar6 = (this->SupportData).NumCigarOperations * 4 + (this->SupportData).QueryNameLength;
    uVar2 = (this->SupportData).QuerySequenceLength;
    uVar9 = (uVar2 + 1 >> 1) + uVar6;
    local_78 = (ulong)(uVar2 + uVar9);
    std::__cxx11::string::assign((char *)this);
    (this->QueryBases)._M_string_length = 0;
    local_88 = &this->QueryBases;
    *(this->QueryBases)._M_dataplus._M_p = '\0';
    local_90 = (string *)CONCAT44(local_90._4_4_,uVar9);
    if (uVar6 < uVar9) {
      std::__cxx11::string::reserve((ulong)local_88);
      for (uVar10 = 0; uVar10 < (this->SupportData).QuerySequenceLength; uVar10 = uVar10 + 1) {
        std::__cxx11::string::append((ulong)local_88,'\x01');
      }
    }
    (this->Qualities)._M_string_length = 0;
    *(this->Qualities)._M_dataplus._M_p = '\0';
    if ((uint)local_90 < (uint)local_78) {
      psVar1 = &this->Qualities;
      if ((this->SupportData).AllCharData._M_dataplus._M_p[(ulong)local_90 & 0xffffffff] == -1) {
        std::__cxx11::string::resize((ulong)psVar1,(char)(this->SupportData).QuerySequenceLength);
      }
      else {
        std::__cxx11::string::reserve((ulong)psVar1);
        for (uVar10 = 0; uVar10 < (this->SupportData).QuerySequenceLength; uVar10 = uVar10 + 1) {
          std::__cxx11::string::append((ulong)psVar1,'\x01');
        }
      }
    }
    (this->AlignedBases)._M_string_length = 0;
    *(this->AlignedBases)._M_dataplus._M_p = '\0';
    if (((this->QueryBases)._M_string_length != 0) && (bVar5 = std::operator!=(local_88,"*"), bVar5)
       ) {
      local_90 = (string *)&this->AlignedBases;
      std::__cxx11::string::reserve((ulong)local_90);
      pCVar8 = (this->CigarData).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar3 = (this->CigarData).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_finish;
LAB_001b06b2:
      if (pCVar8 != pCVar3) {
        cVar7 = pCVar8->Type;
        switch(cVar7) {
        case 'H':
          goto switchD_001b06cf_caseD_48;
        case 'J':
        case 'K':
        case 'L':
        case 'O':
        case 'Q':
        case 'R':
        case 'T':
        case 'U':
        case 'V':
        case 'W':
switchD_001b06cf_caseD_4a:
          std::__cxx11::string::string
                    ((string *)&local_50,"invalid CIGAR operation type: ",&local_91);
          std::operator+(&message,&local_50,pCVar8->Type);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::string((string *)&local_50,"BamAlignment::BuildCharData",&local_91);
          SetErrorString(this,&local_50,&message);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&message);
          return false;
        case 'N':
          cVar7 = (char)pCVar8->Length;
          break;
        case 'P':
          cVar7 = (char)pCVar8->Length;
          break;
        case 'S':
          goto switchD_001b06cf_caseD_53;
        default:
          if (cVar7 == 'D') {
            cVar7 = (char)pCVar8->Length;
            break;
          }
          if (cVar7 != '=') goto switchD_001b06cf_caseD_4a;
        case 'I':
        case 'M':
        case 'X':
          std::__cxx11::string::substr((ulong)&message,(ulong)local_88);
          std::__cxx11::string::append(local_90);
          std::__cxx11::string::~string((string *)&message);
          goto switchD_001b06cf_caseD_53;
        }
        std::__cxx11::string::append((ulong)local_90,cVar7);
        goto switchD_001b06cf_caseD_48;
      }
    }
    (this->TagData)._M_string_length = 0;
    uVar9 = local_7c - 0x20;
    *(this->TagData)._M_dataplus._M_p = '\0';
    uVar6 = (uint)local_78;
    if (uVar6 < uVar9) {
      uVar10 = local_78 & 0xffffffff;
      pcVar4 = (this->SupportData).AllCharData._M_dataplus._M_p;
      std::__cxx11::string::resize((ulong)&this->TagData);
      memcpy((this->TagData)._M_dataplus._M_p,pcVar4 + uVar10,(ulong)(uVar9 - uVar6));
    }
    (this->SupportData).HasCoreOnly = false;
  }
  return true;
switchD_001b06cf_caseD_53:
switchD_001b06cf_caseD_48:
  pCVar8 = pCVar8 + 1;
  goto LAB_001b06b2;
}

Assistant:

bool BamAlignment::BuildCharData()
{

    // skip if char data already parsed
    if (!SupportData.HasCoreOnly) return true;

    // check system endianness
    bool IsBigEndian = BamTools::SystemIsBigEndian();

    // calculate character lengths/offsets
    const unsigned int dataLength = SupportData.BlockLength - Constants::BAM_CORE_SIZE;
    const unsigned int seqDataOffset =
        SupportData.QueryNameLength + (SupportData.NumCigarOperations * 4);
    const unsigned int qualDataOffset = seqDataOffset + (SupportData.QuerySequenceLength + 1) / 2;
    const unsigned int tagDataOffset = qualDataOffset + SupportData.QuerySequenceLength;
    const unsigned int tagDataLength = dataLength - tagDataOffset;

    // check offsets to see what char data exists
    const bool hasSeqData = (seqDataOffset < qualDataOffset);
    const bool hasQualData = (qualDataOffset < tagDataOffset);
    const bool hasTagData = (tagDataOffset < dataLength);

    // store alignment name (relies on null char in name as terminator)
    Name.assign(SupportData.AllCharData.data());

    // save query sequence
    QueryBases.clear();
    if (hasSeqData) {
        const char* seqData = SupportData.AllCharData.data() + seqDataOffset;
        QueryBases.reserve(SupportData.QuerySequenceLength);
        for (std::size_t i = 0; i < SupportData.QuerySequenceLength; ++i) {
            const char singleBase =
                Constants::BAM_DNA_LOOKUP[((seqData[(i / 2)] >> (4 * (1 - (i % 2)))) & 0xf)];
            QueryBases.append(1, singleBase);
        }
    }

    // save qualities

    Qualities.clear();
    if (hasQualData) {
        const char* qualData = SupportData.AllCharData.data() + qualDataOffset;

        // if marked as unstored (sequence of 0xFF) - don't do conversion, just fill with 0xFFs
        if (qualData[0] == (char)0xFF)
            Qualities.resize(SupportData.QuerySequenceLength, (char)0xFF);

        // otherwise convert from numeric QV to 'FASTQ-style' ASCII character
        else {
            Qualities.reserve(SupportData.QuerySequenceLength);
            for (std::size_t i = 0; i < SupportData.QuerySequenceLength; ++i)
                Qualities.append(1, qualData[i] + 33);
        }
    }

    // clear previous AlignedBases
    AlignedBases.clear();

    // if QueryBases has data, build AlignedBases using CIGAR data
    // otherwise, AlignedBases will remain empty (this case IS allowed)
    if (!QueryBases.empty() && QueryBases != "*") {

        // resize AlignedBases
        AlignedBases.reserve(SupportData.QuerySequenceLength);

        // iterate over CigarOps
        int k = 0;
        std::vector<CigarOp>::const_iterator cigarIter = CigarData.begin();
        std::vector<CigarOp>::const_iterator cigarEnd = CigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);

            switch (op.Type) {

                // for 'M', 'I', '=', 'X' - write bases
                case (Constants::BAM_CIGAR_MATCH_CHAR):
                case (Constants::BAM_CIGAR_INS_CHAR):
                case (Constants::BAM_CIGAR_SEQMATCH_CHAR):
                case (Constants::BAM_CIGAR_MISMATCH_CHAR):
                    AlignedBases.append(QueryBases.substr(k, op.Length));
                    // fall through

                // for 'S' - soft clip, do not write bases
                // but increment placeholder 'k'
                case (Constants::BAM_CIGAR_SOFTCLIP_CHAR):
                    k += op.Length;
                    break;

                // for 'D' - write gap character
                case (Constants::BAM_CIGAR_DEL_CHAR):
                    AlignedBases.append(op.Length, Constants::BAM_DNA_DEL);
                    break;

                // for 'P' - write padding character
                case (Constants::BAM_CIGAR_PAD_CHAR):
                    AlignedBases.append(op.Length, Constants::BAM_DNA_PAD);
                    break;

                // for 'N' - write N's, skip bases in original query sequence
                case (Constants::BAM_CIGAR_REFSKIP_CHAR):
                    AlignedBases.append(op.Length, Constants::BAM_DNA_N);
                    break;

                // for 'H' - hard clip, do nothing to AlignedBases, move to next op
                case (Constants::BAM_CIGAR_HARDCLIP_CHAR):
                    break;

                // invalid CIGAR op-code
                default:
                    const std::string message =
                        std::string("invalid CIGAR operation type: ") + op.Type;
                    SetErrorString("BamAlignment::BuildCharData", message);
                    return false;
            }
        }
    }

    // save tag data
    TagData.clear();
    if (hasTagData) {

        char* tagData = (((char*)SupportData.AllCharData.data()) + tagDataOffset);

        if (IsBigEndian) {
            std::size_t i = 0;
            while (i < tagDataLength) {

                i += Constants::BAM_TAG_TAGSIZE;  // skip tag chars (e.g. "RG", "NM", etc.)
                const char type = tagData[i];     // get tag type at position i
                ++i;                              // move i past tag type

                switch (type) {

                    case (Constants::BAM_TAG_TYPE_ASCII):
                    case (Constants::BAM_TAG_TYPE_INT8):
                    case (Constants::BAM_TAG_TYPE_UINT8):
                        // no endian swapping necessary for single-byte data
                        ++i;
                        break;

                    case (Constants::BAM_TAG_TYPE_INT16):
                    case (Constants::BAM_TAG_TYPE_UINT16):
                        BamTools::SwapEndian_16p(&tagData[i]);
                        i += sizeof(uint16_t);
                        break;

                    case (Constants::BAM_TAG_TYPE_FLOAT):
                    case (Constants::BAM_TAG_TYPE_INT32):
                    case (Constants::BAM_TAG_TYPE_UINT32):
                        BamTools::SwapEndian_32p(&tagData[i]);
                        i += sizeof(uint32_t);
                        break;

                    case (Constants::BAM_TAG_TYPE_HEX):
                    case (Constants::BAM_TAG_TYPE_STRING):
                        // no endian swapping necessary for hex-string/string data
                        while (tagData[i])
                            ++i;
                        // increment one more for null terminator
                        ++i;
                        break;

                    case (Constants::BAM_TAG_TYPE_ARRAY):

                    {
                        // read array type
                        const char arrayType = tagData[i];
                        ++i;

                        // swap endian-ness of number of elements in place, then retrieve for loop
                        BamTools::SwapEndian_32p(&tagData[i]);
                        uint32_t numElements;
                        memcpy(&numElements, &tagData[i], sizeof(uint32_t));
                        i += sizeof(uint32_t);

                        // swap endian-ness of array elements
                        for (std::size_t j = 0; j < numElements; ++j) {
                            switch (arrayType) {
                                case (Constants::BAM_TAG_TYPE_INT8):
                                case (Constants::BAM_TAG_TYPE_UINT8):
                                    // no endian-swapping necessary
                                    ++i;
                                    break;
                                case (Constants::BAM_TAG_TYPE_INT16):
                                case (Constants::BAM_TAG_TYPE_UINT16):
                                    BamTools::SwapEndian_16p(&tagData[i]);
                                    i += sizeof(uint16_t);
                                    break;
                                case (Constants::BAM_TAG_TYPE_FLOAT):
                                case (Constants::BAM_TAG_TYPE_INT32):
                                case (Constants::BAM_TAG_TYPE_UINT32):
                                    BamTools::SwapEndian_32p(&tagData[i]);
                                    i += sizeof(uint32_t);
                                    break;
                                default:
                                    const std::string message =
                                        std::string("invalid binary array type: ") + arrayType;
                                    SetErrorString("BamAlignment::BuildCharData", message);
                                    return false;
                            }
                        }

                        break;
                    }

                    // invalid tag type-code
                    default:
                        const std::string message = std::string("invalid tag type: ") + type;
                        SetErrorString("BamAlignment::BuildCharData", message);
                        return false;
                }
            }
        }

        // store tagData in alignment
        TagData.resize(tagDataLength);
        memcpy((char*)(TagData.data()), tagData, tagDataLength);
    }

    // clear core-only flag & return success
    SupportData.HasCoreOnly = false;
    return true;
}